

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

Pdr_Obl_t * Pdr_QueuePop(Pdr_Man_t *p)

{
  Pdr_Obl_t *p_00;
  
  p_00 = p->pQueue;
  if (p_00 == (Pdr_Obl_t *)0x0) {
    p_00 = (Pdr_Obl_t *)0x0;
  }
  else {
    p->pQueue = p_00->pLink;
    Pdr_OblDeref(p_00);
    p->nQueCur = p->nQueCur + -1;
  }
  return p_00;
}

Assistant:

Pdr_Obl_t * Pdr_QueuePop( Pdr_Man_t * p )
{
    Pdr_Obl_t * pRes = p->pQueue;
    if ( p->pQueue == NULL )
        return NULL;
    p->pQueue = p->pQueue->pLink;
    Pdr_OblDeref( pRes );
    p->nQueCur--;
    return pRes;
}